

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O0

void __thiscall pbrt::semantic::PBRTInfo::Counter::print(Counter *this,string *name)

{
  ostream *poVar1;
  string *in_RSI;
  size_t in_stack_00000378;
  string local_60 [48];
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  poVar1 = std::operator<<((ostream *)&std::cout,"number of ");
  poVar1 = std::operator<<(poVar1,local_10);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," - unique    : ");
  math::prettyNumber_abi_cxx11_(in_stack_00000378);
  poVar1 = std::operator<<(poVar1,local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<((ostream *)&std::cout," - instanced : ");
  math::prettyNumber_abi_cxx11_(in_stack_00000378);
  poVar1 = std::operator<<(poVar1,local_60);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void print(const std::string &name)
        {
          std::cout << "number of " << name << std::endl;
          std::cout << " - unique    : " << math::prettyNumber(unique) << std::endl;
          std::cout << " - instanced : " << math::prettyNumber(instanced) << std::endl;
        }